

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleMainExtended.cpp
# Opt level: O3

int enumCallBack(int index,char **buff)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  char *__s;
  string got;
  allocator local_39;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  lVar3 = (long)index + 1;
  std::__cxx11::string::string((string *)local_38,buff[(long)index + 1],&local_39);
  iVar1 = std::__cxx11::string::compare((char *)local_38);
  if (iVar1 == 0) {
LAB_0010b262:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"got enum ",9);
    __s = buff[lVar3];
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x112158);
      goto LAB_0010b2ba;
    }
    sVar2 = strlen(__s);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)local_38);
    if (iVar1 == 0) goto LAB_0010b262;
    iVar1 = std::__cxx11::string::compare((char *)local_38);
    if (iVar1 == 0) goto LAB_0010b262;
    sVar2 = 0xe;
    __s = "gor wrong enum";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
LAB_0010b2ba:
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return (int)lVar3;
}

Assistant:

int enumCallBack(int index, char **buff) {
    index++;
    string got = string(buff[index]);
    if (got == "abc" || got == "def" || got == "xyz") {
        cout << "got enum " << buff[index] << endl;
    } else {
        cout << "gor wrong enum" << endl;
    }
    return index;
}